

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Literal * __thiscall wasm::Literal::extendS32(Literal *__return_storage_ptr__,Literal *this)

{
  if ((this->type).id == 3) {
    *(long *)&__return_storage_ptr__->field_0 = (long)(this->field_0).i32;
    (__return_storage_ptr__->type).id = 3;
    return __return_storage_ptr__;
  }
  handle_unreachable("invalid type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                     ,0x324);
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }